

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QLoggingRule>::reallocateAndGrow
          (QArrayDataPointer<QLoggingRule> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QLoggingRule> *old)

{
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QLoggingRule *pQVar5;
  undefined1 *puVar6;
  PatternFlags PVar7;
  QLoggingRule *data;
  long lVar8;
  QLoggingRule *pQVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<QLoggingRule> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QLoggingRule> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QLoggingRule>::reallocate
                ((QMovableArrayOps<QLoggingRule> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QLoggingRule *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (QLoggingRule *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar8 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QLoggingRule> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar8) {
            pQVar9 = this->ptr;
            pQVar5 = pQVar9 + lVar8;
            do {
              pDVar2 = (pQVar9->category).d.d;
              local_48.ptr[local_48.size].category.d.d = pDVar2;
              local_48.ptr[local_48.size].category.d.ptr = (pQVar9->category).d.ptr;
              local_48.ptr[local_48.size].category.d.size = (pQVar9->category).d.size;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                     (__atomic_base<int>)
                     ((__int_type_conflict)
                      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
                UNLOCK();
              }
              local_48.ptr[local_48.size].enabled = pQVar9->enabled;
              PVar7.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
              super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
                   (pQVar9->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
              local_48.ptr[local_48.size].messageType = pQVar9->messageType;
              local_48.ptr[local_48.size].flags =
                   (PatternFlags)
                   PVar7.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
                   super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
              pQVar9 = pQVar9 + 1;
              local_48.size = local_48.size + 1;
            } while (pQVar9 < pQVar5);
          }
        }
        else if (0 < lVar8) {
          pQVar9 = this->ptr;
          pQVar5 = pQVar9 + lVar8;
          do {
            pDVar2 = (pQVar9->category).d.d;
            (pQVar9->category).d.d = (Data *)0x0;
            local_48.ptr[local_48.size].category.d.d = pDVar2;
            pcVar3 = (pQVar9->category).d.ptr;
            (pQVar9->category).d.ptr = (char16_t *)0x0;
            local_48.ptr[local_48.size].category.d.ptr = pcVar3;
            qVar4 = (pQVar9->category).d.size;
            (pQVar9->category).d.size = 0;
            local_48.ptr[local_48.size].category.d.size = qVar4;
            PVar7.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
            super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
                 (pQVar9->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
            local_48.ptr[local_48.size].messageType = pQVar9->messageType;
            local_48.ptr[local_48.size].flags =
                 (PatternFlags)
                 PVar7.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
                 super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
            local_48.ptr[local_48.size].enabled = pQVar9->enabled;
            pQVar9 = pQVar9 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar9 < pQVar5);
        }
      }
      pDVar1 = this->d;
      pQVar5 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar6 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar1;
      local_48.ptr = pQVar5;
      local_48.size = (qsizetype)puVar6;
      if (old != (QArrayDataPointer<QLoggingRule> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar1;
        old->ptr = pQVar5;
        local_48.size = old->size;
        old->size = (qsizetype)puVar6;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }